

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O2

Var Js::JavascriptObject::EntryCreate(RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Var pvVar7;
  RecyclableObject *pRVar8;
  DynamicObject *object;
  int in_stack_00000010;
  CallInfo local_48;
  CallInfo callInfo_local;
  RecyclableObject *properties;
  ArgumentReader args;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_48 = callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x72d,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00b93a8e;
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)&properties,&local_48,(Var *)&stack0x00000018);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_48 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x733,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00b93a8e;
    *puVar6 = 0;
  }
  if (((uint)properties & 0xfffffe) == 0) {
LAB_00b93a7a:
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec31,L"Object.create");
  }
  pvVar7 = Arguments::operator[]((Arguments *)&properties,1);
  BVar5 = JavascriptOperators::IsObjectOrNull(pvVar7);
  if (BVar5 == 0) goto LAB_00b93a7a;
  pRVar8 = VarTo<Js::RecyclableObject>(pvVar7);
  object = JavascriptLibrary::CreateObject((((function->type).ptr)->javascriptLibrary).ptr,pRVar8,0)
  ;
  bVar4 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
  if (bVar4) {
    pRVar8 = JavascriptProxy::AutoProxyWrapper(object);
    object = VarTo<Js::DynamicObject,Js::RecyclableObject>(pRVar8);
  }
  if (2 < ((uint)properties & 0xffffff)) {
    pvVar7 = Arguments::operator[]((Arguments *)&properties,2);
    if (pvVar7 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00b93a8e;
      *puVar6 = 0;
    }
    bVar4 = TaggedInt::Is(pvVar7);
    if ((ulong)pvVar7 >> 0x32 == 0 && !bVar4) {
      pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar7);
      if (pRVar8 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_00b93a8e;
        *puVar6 = 0;
      }
      TVar1 = ((pRVar8->type).ptr)->typeId;
      if ((int)TVar1 < 0x58) {
        if (TVar1 == TypeIds_Undefined) {
          return object;
        }
      }
      else {
        BVar5 = RecyclableObject::IsExternal(pRVar8);
        if (BVar5 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar6 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar4) {
LAB_00b93a8e:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar6 = 0;
        }
      }
    }
    callInfo_local = (CallInfo)0x0;
    pvVar7 = Arguments::operator[]((Arguments *)&properties,2);
    BVar5 = JavascriptConversion::ToObject(pvVar7,pSVar2,(RecyclableObject **)&callInfo_local);
    if (BVar5 == 0) {
      JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec32,L"Object.create");
    }
    DefinePropertiesHelper
              (&object->super_RecyclableObject,(RecyclableObject *)callInfo_local,pSVar2);
  }
  return object;
}

Assistant:

Var JavascriptObject::EntryCreate(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();


    CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Object_Constructor_create)

    Assert(!(callInfo.Flags & CallFlags_New));

    if (args.Info.Count < 2)
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NotObjectOrNull, _u("Object.create"));
    }

    Var protoVar = args[1];
    if (!JavascriptOperators::IsObjectOrNull(protoVar))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NotObjectOrNull, _u("Object.create"));
    }

    RecyclableObject* protoObj = VarTo<RecyclableObject>(protoVar);
    DynamicObject* object = function->GetLibrary()->CreateObject(protoObj);

    JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(object));
#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
    {
        object = VarTo<DynamicObject>(JavascriptProxy::AutoProxyWrapper(object));
    }
#endif

    if (args.Info.Count > 2 && JavascriptOperators::GetTypeId(args[2]) != TypeIds_Undefined)
    {
        RecyclableObject* properties = nullptr;
        if (FALSE == JavascriptConversion::ToObject(args[2], scriptContext, &properties))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NullOrUndefined, _u("Object.create"));
        }
        return DefinePropertiesHelper(object, properties, scriptContext);
    }
    return object;
}